

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiStorage::SetInt(ImGuiStorage *this,ImGuiID key,int val)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Pair *pPVar4;
  ulong uVar5;
  Pair *pPVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  
  pPVar4 = (this->Data).Data;
  iVar2 = (this->Data).Size;
  pPVar6 = pPVar4;
  uVar8 = (long)iVar2;
  while (uVar5 = uVar8, uVar5 != 0) {
    uVar8 = uVar5 >> 1;
    if (pPVar6[uVar8].key < key) {
      pPVar6 = pPVar6 + uVar8 + 1;
      uVar8 = ~uVar8 + uVar5;
    }
  }
  if ((pPVar6 == pPVar4 + iVar2) || (pPVar6->key != key)) {
    lVar11 = (long)pPVar6 - (long)pPVar4;
    iVar3 = (this->Data).Capacity;
    if (iVar2 == iVar3) {
      if (iVar3 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar3 / 2 + iVar3;
      }
      iVar12 = iVar2 + 1;
      if (iVar2 + 1 < iVar7) {
        iVar12 = iVar7;
      }
      if (iVar3 < iVar12) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pPVar6 = (Pair *)(*GImAllocatorAllocFunc)((long)iVar12 << 4,GImAllocatorUserData);
        pPVar4 = (this->Data).Data;
        if (pPVar4 != (Pair *)0x0) {
          memcpy(pPVar6,pPVar4,(long)(this->Data).Size << 4);
          pPVar4 = (this->Data).Data;
          if ((pPVar4 != (Pair *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pPVar4,GImAllocatorUserData);
        }
        (this->Data).Data = pPVar6;
        (this->Data).Capacity = iVar12;
      }
    }
    lVar9 = (long)(this->Data).Size;
    lVar10 = lVar9 - (lVar11 >> 4);
    if (lVar10 != 0 && lVar11 >> 4 <= lVar9) {
      pPVar4 = (this->Data).Data;
      memmove((void *)((long)pPVar4 + lVar11 + 0x10),(void *)((long)pPVar4 + lVar11),lVar10 * 0x10);
    }
    pPVar4 = (this->Data).Data;
    *(ImGuiID *)((long)pPVar4 + lVar11) = key;
    *(int *)((long)pPVar4 + lVar11 + 8) = val;
    (this->Data).Size = (this->Data).Size + 1;
  }
  else {
    (pPVar6->field_1).val_i = val;
  }
  return;
}

Assistant:

void ImGuiStorage::SetInt(ImGuiID key, int val)
{
    ImGuiStorage::Pair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, Pair(key, val));
        return;
    }
    it->val_i = val;
}